

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

void do_crop(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
            JDIMENSION y_crop_offset,jvirt_barray_ptr *src_coef_arrays,
            jvirt_barray_ptr *dst_coef_arrays)

{
  int iVar1;
  JBLOCKROW output_row;
  JBLOCKROW input_row;
  int in_ECX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  jpeg_component_info *compptr;
  JBLOCKARRAY dst_buffer;
  JBLOCKARRAY src_buffer;
  int offset_y;
  int ci;
  JDIMENSION y_crop_blocks;
  JDIMENSION x_crop_blocks;
  JDIMENSION dst_blk_y;
  int local_3c;
  int local_38;
  uint local_2c;
  
  for (local_38 = 0; local_38 < *(int *)(in_RSI + 0x4c); local_38 = local_38 + 1) {
    output_row = (JBLOCKROW)(*(long *)(in_RSI + 0x58) + (long)local_38 * 0x60);
    iVar1 = *(int *)(*output_row + 6);
    for (local_2c = 0; local_2c < *(uint *)(*output_row + 0x10);
        local_2c = *(int *)(*output_row + 6) + local_2c) {
      input_row = (JBLOCKROW)
                  (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                            (in_RDI,*(undefined8 *)(in_R9 + (long)local_38 * 8),local_2c,
                             *(undefined4 *)(*output_row + 6),1);
      (**(code **)(*(long *)(in_RDI + 8) + 0x40))
                (in_RDI,*(undefined8 *)(in_R8 + (long)local_38 * 8),local_2c + in_ECX * iVar1,
                 *(undefined4 *)(*output_row + 6),0);
      for (local_3c = 0; local_3c < *(int *)(*output_row + 6); local_3c = local_3c + 1) {
        jcopy_block_row(input_row,output_row,0);
      }
    }
  }
  return;
}

Assistant:

LOCAL(void)
do_crop(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
        JDIMENSION x_crop_offset, JDIMENSION y_crop_offset,
        jvirt_barray_ptr *src_coef_arrays,
        jvirt_barray_ptr *dst_coef_arrays)
/* Crop.  This is only used when no rotate/flip is requested with the crop. */
{
  JDIMENSION dst_blk_y, x_crop_blocks, y_crop_blocks;
  int ci, offset_y;
  JBLOCKARRAY src_buffer, dst_buffer;
  jpeg_component_info *compptr;

  /* We simply have to copy the right amount of data (the destination's
   * image size) starting at the given X and Y offsets in the source.
   */
  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    x_crop_blocks = x_crop_offset * compptr->h_samp_factor;
    y_crop_blocks = y_crop_offset * compptr->v_samp_factor;
    for (dst_blk_y = 0; dst_blk_y < compptr->height_in_blocks;
         dst_blk_y += compptr->v_samp_factor) {
      dst_buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, dst_coef_arrays[ci], dst_blk_y,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      src_buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, src_coef_arrays[ci], dst_blk_y + y_crop_blocks,
         (JDIMENSION)compptr->v_samp_factor, FALSE);
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        jcopy_block_row(src_buffer[offset_y] + x_crop_blocks,
                        dst_buffer[offset_y], compptr->width_in_blocks);
      }
    }
  }
}